

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O1

err_t belsStdM(octet *m,size_t len,size_t num)

{
  bool_t bVar1;
  u32 *puVar2;
  u32 *puVar3;
  err_t eVar4;
  
  eVar4 = 0x6d;
  if ((len < 0x21) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) {
    bVar1 = memIsValid(m,len);
    if ((num < 0x11) && (bVar1 != 0)) {
      puVar3 = m_32;
      if (len == 0x18) {
        puVar3 = m_24;
      }
      puVar2 = m_16;
      if (len != 0x10) {
        puVar2 = puVar3;
      }
      u32To(m,4,puVar2 + num);
      eVar4 = 0;
      memSet(m + 4,'\0',len - 4);
    }
  }
  return eVar4;
}

Assistant:

err_t belsStdM(octet m[], size_t len, size_t num)
{
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || 
		!memIsValid(m, len) || num > 16)
		return ERR_BAD_INPUT;
	// загрузить
	if (len == 16)
		u32To(m, 4, m_16 + num);
	else if (len == 24)
		u32To(m, 4, m_24 + num);
	else
		u32To(m, 4, m_32 + num);
	memSetZero(m + 4, len - 4);
	return ERR_OK;
}